

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O1

Character * __thiscall World::GetCharacter(World *this,string *name)

{
  pointer ppCVar1;
  Character *pCVar2;
  int iVar3;
  pointer ppCVar4;
  bool bVar5;
  string local_50;
  
  util::lowercase(&local_50,name);
  std::__cxx11::string::operator=((string *)name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppCVar4 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  ppCVar1 = (this->characters).super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppCVar4 == ppCVar1) {
      return (Character *)0x0;
    }
    pCVar2 = *ppCVar4;
    (*(pCVar2->super_Command_Source)._vptr_Command_Source[2])(&local_50,pCVar2);
    if (local_50._M_string_length == name->_M_string_length) {
      if (local_50._M_string_length == 0) {
        bVar5 = true;
      }
      else {
        iVar3 = bcmp(local_50._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_50._M_string_length);
        bVar5 = iVar3 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) break;
    ppCVar4 = ppCVar4 + 1;
  }
  return pCVar2;
}

Assistant:

Character *World::GetCharacter(std::string name)
{
	name = util::lowercase(name);

	UTIL_FOREACH(this->characters, character)
	{
		if (character->SourceName() == name)
		{
			return character;
		}
	}

	return 0;
}